

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O2

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,String *data)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  append(__return_storage_ptr__,data);
  return __return_storage_ptr__;
}

Assistant:

String String::operator+ (const String& data) const
{
	String newString = *this;
	newString.append (data);
	return newString;
}